

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

AssertionResult __thiscall testing::AssertionFailure(testing *this,Message *message)

{
  AssertionResult *other;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar1;
  AssertionResult local_20;
  
  local_20.success_ = false;
  local_20.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  other = AssertionResult::operator<<(&local_20,message);
  AssertionResult::AssertionResult((AssertionResult *)this,other);
  internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  AVar1.message_.ptr_ = extraout_RDX.ptr_;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult AssertionFailure(const Message& message) {
  return AssertionFailure() << message;
}